

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool __thiscall
miniply::PLYReader::ascii_value(PLYReader *this,PLYPropertyType propType,uint8_t *value)

{
  bool bVar1;
  int local_2c;
  uint8_t *puStack_28;
  int tmpInt;
  uint8_t *value_local;
  PLYReader *pPStack_18;
  PLYPropertyType propType_local;
  PLYReader *this_local;
  
  local_2c = 0;
  puStack_28 = value;
  value_local._4_4_ = propType;
  pPStack_18 = this;
  switch(propType) {
  case Char:
  case UChar:
  case Short:
  case UShort:
    bVar1 = int_literal(this,&local_2c);
    this->m_valid = bVar1;
    break;
  case Int:
  case UInt:
    bVar1 = int_literal(this,(int *)value);
    this->m_valid = bVar1;
    break;
  case Float:
    bVar1 = float_literal(this,(float *)value);
    this->m_valid = bVar1;
    break;
  case Double:
  default:
    bVar1 = double_literal(this,(double *)value);
    this->m_valid = bVar1;
  }
  if ((this->m_valid & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    advance(this);
    switch(value_local._4_4_) {
    case Char:
      *puStack_28 = (uint8_t)local_2c;
      break;
    case UChar:
      *puStack_28 = (uint8_t)local_2c;
      break;
    case Short:
      *(short *)puStack_28 = (short)local_2c;
      break;
    case UShort:
      *(short *)puStack_28 = (short)local_2c;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PLYReader::ascii_value(PLYPropertyType propType, uint8_t value[8])
  {
    int tmpInt = 0;

    switch (propType) {
    case PLYPropertyType::Char:
    case PLYPropertyType::UChar:
    case PLYPropertyType::Short:
    case PLYPropertyType::UShort:
      m_valid = int_literal(&tmpInt);
      break;
    case PLYPropertyType::Int:
    case PLYPropertyType::UInt:
      m_valid = int_literal(reinterpret_cast<int*>(value));
      break;
    case PLYPropertyType::Float:
      m_valid = float_literal(reinterpret_cast<float*>(value));
      break;
    case PLYPropertyType::Double:
    default:
      m_valid = double_literal(reinterpret_cast<double*>(value));
      break;
    }

    if (!m_valid) {
      return false;
    }
    advance();

    switch (propType) {
    case PLYPropertyType::Char:
      reinterpret_cast<int8_t*>(value)[0] = static_cast<int8_t>(tmpInt);
      break;
    case PLYPropertyType::UChar:
      value[0] = static_cast<uint8_t>(tmpInt);
      break;
    case PLYPropertyType::Short:
      reinterpret_cast<int16_t*>(value)[0] = static_cast<int16_t>(tmpInt);
      break;
    case PLYPropertyType::UShort:
      reinterpret_cast<uint16_t*>(value)[0] = static_cast<uint16_t>(tmpInt);
      break;
    default:
      break;
    }
    return true;
  }